

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

AsyncGeneratorCallbackFunction * __thiscall
Js::JavascriptLibrary::CreateAsyncGeneratorCallbackFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,JavascriptAsyncGenerator *generator)

{
  DynamicObject *prototype;
  code *pcVar1;
  JavascriptAsyncGenerator *entryPoint_00;
  bool bVar2;
  ScriptContext *pSVar3;
  ScriptConfiguration *this_00;
  undefined4 *puVar4;
  Recycler *pRVar5;
  FunctionInfo *this_01;
  ScriptContext **ppSVar6;
  DynamicObject **ppDVar7;
  DynamicTypeHandler *typeHandler;
  AsyncGeneratorCallbackFunction *this_02;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_91;
  TrackAllocData local_90;
  DynamicType *local_68;
  DynamicType *type;
  undefined8 local_58;
  TrackAllocData local_50;
  FunctionInfo *local_28;
  FunctionInfo *functionInfo;
  JavascriptAsyncGenerator *generator_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  functionInfo = (FunctionInfo *)generator;
  generator_local = (JavascriptAsyncGenerator *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  pSVar3 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                     (&(this->super_JavascriptLibraryBase).scriptContext);
  this_00 = ScriptContext::GetConfig(pSVar3);
  bVar2 = ScriptConfiguration::IsES2018AsyncIterationEnabled(this_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x196d,
                                "(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled())",
                                "scriptContext->GetConfig()->IsES2018AsyncIterationEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x196f);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_50);
  type = (DynamicType *)Memory::Recycler::AllocInlined;
  local_58 = 0;
  this_01 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar5,0x43c4b0);
  FunctionInfo::FunctionInfo
            (this_01,(JavascriptMethod)generator_local,None,0xffffffff,(FunctionProxy *)0x0);
  local_28 = this_01;
  ppSVar6 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  pSVar3 = *ppSVar6;
  ppDVar7 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
  entryPoint_00 = generator_local;
  prototype = *ppDVar7;
  typeHandler = GetDeferredAnonymousFunctionTypeHandler(this);
  local_68 = DynamicType::New(pSVar3,TypeIds_Function,&prototype->super_RecyclableObject,
                              (JavascriptMethod)entryPoint_00,typeHandler,false,false);
  pRVar5 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&AsyncGeneratorCallbackFunction::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x197e);
  pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_90);
  this_02 = (AsyncGeneratorCallbackFunction *)new<(Memory::ObjectInfoBits)1>(0x48,pRVar5,&local_91);
  AsyncGeneratorCallbackFunction::AsyncGeneratorCallbackFunction
            (this_02,local_68,local_28,(JavascriptAsyncGenerator *)functionInfo);
  return this_02;
}

Assistant:

AsyncGeneratorCallbackFunction* JavascriptLibrary::CreateAsyncGeneratorCallbackFunction(
        JavascriptMethod entryPoint,
        JavascriptAsyncGenerator* generator)
    {
        Assert(scriptContext->GetConfig()->IsES2018AsyncIterationEnabled());

        auto* functionInfo = RecyclerNew(GetRecycler(), FunctionInfo, entryPoint);

        auto* type = DynamicType::New(
            scriptContext,
            TypeIds_Function,
            functionPrototype,
            entryPoint,
            GetDeferredAnonymousFunctionTypeHandler());

        return RecyclerNewEnumClass(
            GetRecycler(),
            EnumFunctionClass,
            AsyncGeneratorCallbackFunction,
            type,
            functionInfo,
            generator);
    }